

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.cpp
# Opt level: O2

void __thiscall pstore::exchange::import_ns::rule::log_top_impl(rule *this,bool is_push)

{
  context *pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ostream *poVar5;
  _Elt_pointer puVar6;
  undefined4 extraout_var;
  double __x;
  char *local_1d0 [4];
  not_null<const_char_*> local_1b0;
  ostringstream str;
  
  bVar2 = logging_enabled();
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    pcVar1 = (this->context_).ptr_;
    sVar4 = std::
            deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
            ::size(&(pcVar1->stack).c);
    while (bVar2 = sVar4 != 0, sVar4 = sVar4 - 1, bVar2) {
      std::ostream::write((char *)&str,0x1cabbb);
    }
    poVar5 = std::operator<<((ostream *)&str,!is_push * '\x02' + '+');
    puVar6 = (pcVar1->stack).c.
             super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar6 == (pcVar1->stack).c.
                  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      puVar6 = (pcVar1->stack).c.
               super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    iVar3 = (*(puVar6[-1]._M_t.
               super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
               .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl)->
              _vptr_rule[2])();
    std::operator<<(poVar5,(char *)CONCAT44(extraout_var,iVar3));
    std::__cxx11::stringbuf::str();
    local_1b0.ptr_ = local_1d0[0];
    gsl::not_null<const_char_*>::ensure_invariant(&local_1b0);
    log((pstore *)0x5,__x);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
    return;
  }
  assert_failed("logging_enabled ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_rule.cpp"
                ,0x55);
}

Assistant:

void rule::log_top_impl (bool const is_push) const {
                PSTORE_ASSERT (logging_enabled ());
                std::ostringstream str;
                auto const & stack = context_->stack;
                str << indent{stack.size ()} << (is_push ? '+' : '-') << stack.top ()->name ();
                log (logger::priority::notice, str.str ().c_str ());
            }